

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.cpp
# Opt level: O3

ByteVector * base64_decode(ByteVector *__return_storage_ptr__,string *str)

{
  int iVar1;
  size_type sVar2;
  byte *pbVar3;
  uchar uVar5;
  uint uVar4;
  byte *pbVar6;
  uchar local_39;
  uchar local_38;
  uchar local_37;
  uchar local_36;
  uchar local_35;
  uchar local_34;
  uchar local_33;
  uchar local_32;
  uchar local_31;
  
  sVar2 = str->_M_string_length;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,
             (long)((sVar2 * 0x40000000 + 0xc0000000 & 0xffffffff00000000) * 3) >> 0x20);
  sVar2 = str->_M_string_length;
  if (sVar2 == 0) {
    return __return_storage_ptr__;
  }
  pbVar3 = (byte *)(str->_M_dataplus)._M_p;
  iVar1 = 0;
  uVar4 = 0;
  pbVar6 = pbVar3;
  do {
    if (char2b64[*pbVar6] < 0) {
      if (*pbVar6 == 0x3d) break;
    }
    else {
      uVar4 = uVar4 << 6 | char2b64[*pbVar6];
      iVar1 = iVar1 + 1;
      if (iVar1 == 4) {
        local_35 = (uchar)(uVar4 >> 0x10);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (__return_storage_ptr__,&local_35);
        local_36 = (uchar)(uVar4 >> 8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (__return_storage_ptr__,&local_36);
        local_37 = (uchar)uVar4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (__return_storage_ptr__,&local_37);
        pbVar3 = (byte *)(str->_M_dataplus)._M_p;
        sVar2 = str->_M_string_length;
        iVar1 = 0;
        uVar4 = 0;
      }
    }
    pbVar6 = pbVar6 + 1;
  } while (pbVar6 != pbVar3 + sVar2);
  if (iVar1 != 3) {
    if (iVar1 != 2) {
      if (iVar1 != 1) goto LAB_001186bb;
      uVar4 = uVar4 << 6;
    }
    uVar4 = uVar4 << 6;
  }
  uVar4 = uVar4 << 6;
LAB_001186bb:
  local_34 = (uchar)(uVar4 >> 0x10);
  if (iVar1 == 2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_34);
  }
  else {
    uVar5 = (uchar)(uVar4 >> 8);
    if (iVar1 == 3) {
      local_33 = local_34;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_33);
      local_39 = uVar5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_39);
    }
    else if (iVar1 == 4) {
      local_31 = local_34;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_31);
      local_38 = uVar5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_38);
      local_32 = (uchar)uVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,&local_32);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteVector base64_decode(const std::string& str)
{
    size_t b64size= int((str.size()+3)/4)*3;

    int n=0;
    uint32_t value= 0;
    ByteVector data; data.reserve(b64size);
    for (std::string::const_iterator i= str.begin() ; i!=str.end() ; i++)
    {
        int b= char2b64[((unsigned)*i)&0xff];
        if (b>=0) {
            value= (value<<6) | b;
            n++;
            if (n==4) {
                data.push_back(value>>16);
                data.push_back(value>>8);
                data.push_back(value);
                n= 0;
                value= 0;
            }
        }
        else if (b==-2)
            break;
    }
    switch(n)
    {
        // fall through all!!
        case 1: value <<= 6;  [[fallthrough]];
        case 2: value <<= 6;  [[fallthrough]];
        case 3: value <<= 6;  [[fallthrough]];
        case 4: break;
        case 0: break;
    } 
    switch(n)
    {
        case 4:
                data.push_back(value>>16);
                data.push_back(value>>8);
                data.push_back(value);
                break;
        case 3:
                data.push_back(value>>16);
                data.push_back(value>>8);
                break;
        case 2:
                data.push_back(value>>16);
                break;
        case 1:
                // note: 1 base64 char should not happen
        case 0:
                break;
    }
    return data;
}